

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O2

int XMLSearch_search_get_attribute_index(XMLSearch *search,SXML_CHAR *attr_name)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if ((attr_name != (SXML_CHAR *)0x0 && search != (XMLSearch *)0x0) && (*attr_name != '\0')) {
    uVar4 = 0;
    uVar3 = (ulong)(uint)search->n_attributes;
    if (search->n_attributes < 1) {
      uVar3 = uVar4;
    }
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      iVar1 = strcmp(*(char **)((long)&search->attributes->name + uVar4),attr_name);
      if (iVar1 == 0) {
        return (int)uVar2;
      }
      uVar4 = uVar4 + 0x18;
    }
  }
  return -1;
}

Assistant:

int XMLSearch_search_get_attribute_index(const XMLSearch* search, const SXML_CHAR* attr_name)
{
	int i;

	if (search == NULL || attr_name == NULL || attr_name[0] == NULC)
		return -1;

	for (i = 0; i < search->n_attributes; i++) {
		if (!sx_strcmp(search->attributes[i].name, attr_name))
			return i;
	}

	return -1;
}